

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scgi_api.cpp
# Opt level: O2

const_buffer * __thiscall
cppcms::impl::cgi::scgi::format_output
          (const_buffer *__return_storage_ptr__,scgi *this,const_buffer *in,bool param_2,
          error_code *param_3)

{
  const_buffer cStack_48;
  
  if (this->headers_written_ == true) {
    booster::aio::buffer_impl<const_char_*>::buffer_impl
              (&__return_storage_ptr__->super_buffer_impl<const_char_*>,
               &in->super_buffer_impl<const_char_*>);
  }
  else {
    this->headers_written_ = true;
    booster::aio::buffer(&cStack_48,&this->headers_);
    booster::aio::operator+(__return_storage_ptr__,&cStack_48,in);
    std::
    _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ::~_Vector_base(&cStack_48.super_buffer_impl<const_char_*>.vec_.
                     super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

virtual booster::aio::const_buffer format_output(booster::aio::const_buffer const &in,bool /*comleted*/,booster::system::error_code &/*e*/) 
		{
			if(headers_written_)
				return in;
			headers_written_=true;
			return booster::aio::buffer(headers_) + in;
		}